

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

void Eigen::internal::queryCacheSizes(int *l1,int *l2,int *l3)

{
  long lVar1;
  int max_std_funcs;
  uint uVar2;
  uint uVar3;
  
  lVar1 = cpuid_basic_info(0);
  max_std_funcs = *(int *)(lVar1 + 4);
  uVar3 = *(uint *)(lVar1 + 8);
  uVar2 = *(uint *)(lVar1 + 0xc);
  if (max_std_funcs == 0x68747541) {
    uVar3 = uVar3 ^ 0x69746e65;
    uVar2 = uVar2 ^ 0x444d4163;
  }
  else {
    if (max_std_funcs != 0x69444d41) {
      if ((max_std_funcs == 0x756e6547) && (uVar2 == 0x6c65746e && uVar3 == 0x49656e69)) {
        queryCacheSizes_intel(l1,l2,l3,0x756e6547);
        return;
      }
      goto LAB_001066ee;
    }
    uVar3 = uVar3 ^ 0x74656273;
    uVar2 = uVar2 ^ 0x21726574;
  }
  if (uVar2 == 0 && uVar3 == 0) {
    queryCacheSizes_amd(l1,l2,l3);
    return;
  }
LAB_001066ee:
  queryCacheSizes_intel(l1,l2,l3,max_std_funcs);
  return;
}

Assistant:

inline void queryCacheSizes(int& l1, int& l2, int& l3)
{
  #ifdef EIGEN_CPUID
  int abcd[4];
  const int GenuineIntel[] = {0x756e6547, 0x49656e69, 0x6c65746e};
  const int AuthenticAMD[] = {0x68747541, 0x69746e65, 0x444d4163};
  const int AMDisbetter_[] = {0x69444d41, 0x74656273, 0x21726574}; // "AMDisbetter!"

  // identify the CPU vendor
  EIGEN_CPUID(abcd,0x0,0);
  int max_std_funcs = abcd[1];
  if(cpuid_is_vendor(abcd,GenuineIntel))
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);
  else if(cpuid_is_vendor(abcd,AuthenticAMD) || cpuid_is_vendor(abcd,AMDisbetter_))
    queryCacheSizes_amd(l1,l2,l3);
  else
    // by default let's use Intel's API
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);

  // here is the list of other vendors:
//   ||cpuid_is_vendor(abcd,"VIA VIA VIA ")
//   ||cpuid_is_vendor(abcd,"CyrixInstead")
//   ||cpuid_is_vendor(abcd,"CentaurHauls")
//   ||cpuid_is_vendor(abcd,"GenuineTMx86")
//   ||cpuid_is_vendor(abcd,"TransmetaCPU")
//   ||cpuid_is_vendor(abcd,"RiseRiseRise")
//   ||cpuid_is_vendor(abcd,"Geode by NSC")
//   ||cpuid_is_vendor(abcd,"SiS SiS SiS ")
//   ||cpuid_is_vendor(abcd,"UMC UMC UMC ")
//   ||cpuid_is_vendor(abcd,"NexGenDriven")
  #else
  l1 = l2 = l3 = -1;
  #endif
}